

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::solveConstraints(btSoftBody *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Link *pLVar4;
  Anchor *pAVar5;
  btTransform *this_00;
  _ *p_Var6;
  vsolver_t p_Var7;
  Node *pNVar8;
  _ *p_Var9;
  psolver_t p_Var10;
  btSoftBody *in_RDI;
  btScalar bVar11;
  btVector3 bVar12;
  Node *n_3;
  int ni_1;
  int i_1;
  int iseq_2;
  int idrift;
  Node *n_2;
  btScalar vcf;
  Node *n_1;
  btScalar vc;
  int iseq_1;
  btScalar ti;
  int isolve_1;
  Node *n;
  int iseq;
  int isolve;
  btVector3 ra;
  Anchor *a;
  Link *l;
  int ni;
  int i;
  undefined1 in_stack_fffffffffffffe9f;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  btVector3 *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  btScalar in_stack_fffffffffffffeb4;
  btVector3 local_128;
  Node *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  Node *local_100;
  float local_f8;
  btScalar local_f4;
  btScalar local_f0;
  btScalar local_ec;
  btVector3 local_e8;
  btVector3 in_stack_ffffffffffffff28;
  btSoftBody *this_01;
  undefined8 local_c8;
  undefined8 local_c0;
  int local_ac;
  int local_a4;
  undefined8 local_90;
  undefined8 local_88;
  int local_78;
  int local_74;
  btVector3 *in_stack_ffffffffffffff90;
  btMatrix3x3 *in_stack_ffffffffffffff98;
  btScalar in_stack_ffffffffffffffa4;
  btScalar in_stack_ffffffffffffffa8;
  btScalar in_stack_ffffffffffffffac;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_20;
  int local_c;
  
  applyClusters(this,i._3_1_);
  local_c = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Link>::size(&in_RDI->m_links);
  for (; local_c < iVar1; local_c = local_c + 1) {
    pLVar4 = btAlignedObjectArray<btSoftBody::Link>::operator[](&in_RDI->m_links,local_c);
    bVar12 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8);
    local_28 = bVar12.m_floats._0_8_;
    *(undefined8 *)(pLVar4->m_c3).m_floats = local_28;
    local_20 = bVar12.m_floats._8_8_;
    *(undefined8 *)((pLVar4->m_c3).m_floats + 2) = local_20;
    bVar11 = btVector3::length2((btVector3 *)0x27780a);
    pLVar4->m_c2 = 1.0 / (bVar11 * pLVar4->m_c0);
  }
  local_c = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Anchor>::size(&in_RDI->m_anchors);
  for (; local_c < iVar1; local_c = local_c + 1) {
    pAVar5 = btAlignedObjectArray<btSoftBody::Anchor>::operator[](&in_RDI->m_anchors,local_c);
    this_00 = btCollisionObject::getWorldTransform(&pAVar5->m_body->super_btCollisionObject);
    btTransform::getBasis(this_00);
    bVar12 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb4 = (in_RDI->m_sst).sdt;
    btRigidBody::getInvMass(pAVar5->m_body);
    btRigidBody::getInvInertiaTensorWorld(pAVar5->m_body);
    ImpulseMatrix(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    btMatrix3x3::operator=(&pAVar5->m_c0,(btMatrix3x3 *)&stack0xffffffffffffff90);
    local_40 = bVar12.m_floats._0_8_;
    *(undefined8 *)(pAVar5->m_c1).m_floats = local_40;
    local_38 = bVar12.m_floats._8_8_;
    *(undefined8 *)((pAVar5->m_c1).m_floats + 2) = local_38;
    pAVar5->m_c2 = (in_RDI->m_sst).sdt * pAVar5->m_node->m_im;
    btCollisionObject::activate
              ((btCollisionObject *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (bool)in_stack_fffffffffffffe9f);
  }
  if (0 < (in_RDI->m_cfg).viterations) {
    for (local_74 = 0; local_74 < (in_RDI->m_cfg).viterations; local_74 = local_74 + 1) {
      local_78 = 0;
      while (in_stack_fffffffffffffeb0 = local_78,
            iVar1 = btAlignedObjectArray<btSoftBody::eVSolver::_>::size
                              (&(in_RDI->m_cfg).m_vsequence), in_stack_fffffffffffffeb0 < iVar1) {
        p_Var6 = btAlignedObjectArray<btSoftBody::eVSolver::_>::operator[]
                           (&(in_RDI->m_cfg).m_vsequence,local_78);
        p_Var7 = getSolver(*p_Var6);
        (*p_Var7)(in_RDI,1.0);
        local_78 = local_78 + 1;
      }
    }
    local_c = 0;
    iVar1 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
    for (; local_c < iVar1; local_c = local_c + 1) {
      pNVar8 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_c);
      in_stack_fffffffffffffea8 = &pNVar8->m_q;
      ::operator*((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                  in_stack_fffffffffffffea8->m_floats);
      bVar12 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8);
      local_90 = bVar12.m_floats._0_8_;
      *(undefined8 *)(pNVar8->m_x).m_floats = local_90;
      local_88 = bVar12.m_floats._8_8_;
      *(undefined8 *)((pNVar8->m_x).m_floats + 2) = local_88;
    }
  }
  if (0 < (in_RDI->m_cfg).piterations) {
    for (local_a4 = 0; local_a4 < (in_RDI->m_cfg).piterations; local_a4 = local_a4 + 1) {
      iVar1 = (in_RDI->m_cfg).piterations;
      local_ac = 0;
      while (iVar3 = local_ac,
            iVar2 = btAlignedObjectArray<btSoftBody::ePSolver::_>::size
                              (&(in_RDI->m_cfg).m_psequence), iVar3 < iVar2) {
        p_Var9 = btAlignedObjectArray<btSoftBody::ePSolver::_>::operator[]
                           (&(in_RDI->m_cfg).m_psequence,local_ac);
        p_Var10 = getSolver(*p_Var9);
        (*p_Var10)(in_RDI,1.0,(float)local_a4 / (float)iVar1);
        local_ac = local_ac + 1;
      }
    }
    local_c = 0;
    iVar1 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
    for (; local_c < iVar1; local_c = local_c + 1) {
      pNVar8 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_c);
      in_stack_ffffffffffffff28 =
           operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
      bVar12 = ::operator*((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           in_stack_fffffffffffffea8->m_floats);
      local_c8 = bVar12.m_floats._0_8_;
      *(undefined8 *)(pNVar8->m_v).m_floats = local_c8;
      local_c0 = bVar12.m_floats._8_8_;
      *(undefined8 *)((pNVar8->m_v).m_floats + 2) = local_c0;
      local_ec = 0.0;
      local_f0 = 0.0;
      local_f4 = 0.0;
      btVector3::btVector3(&local_e8,&local_ec,&local_f0,&local_f4);
      *(undefined8 *)(pNVar8->m_f).m_floats = local_e8.m_floats._0_8_;
      *(undefined8 *)((pNVar8->m_f).m_floats + 2) = local_e8.m_floats._8_8_;
    }
  }
  this_01 = in_stack_ffffffffffffff28.m_floats._8_8_;
  if (0 < (in_RDI->m_cfg).diterations) {
    local_f8 = (in_RDI->m_cfg).kVCF * (in_RDI->m_sst).isdt;
    local_c = 0;
    iVar1 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
    for (; local_c < iVar1; local_c = local_c + 1) {
      local_100 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_c);
      *(undefined8 *)(local_100->m_q).m_floats = *(undefined8 *)(local_100->m_x).m_floats;
      *(undefined8 *)((local_100->m_q).m_floats + 2) =
           *(undefined8 *)((local_100->m_x).m_floats + 2);
    }
    for (local_104 = 0; local_104 < (in_RDI->m_cfg).diterations; local_104 = local_104 + 1) {
      local_108 = 0;
      while (iVar1 = local_108,
            iVar3 = btAlignedObjectArray<btSoftBody::ePSolver::_>::size
                              (&(in_RDI->m_cfg).m_dsequence), iVar1 < iVar3) {
        p_Var9 = btAlignedObjectArray<btSoftBody::ePSolver::_>::operator[]
                           (&(in_RDI->m_cfg).m_dsequence,local_108);
        p_Var10 = getSolver(*p_Var9);
        (*p_Var10)(in_RDI,1.0,0.0);
        local_108 = local_108 + 1;
      }
    }
    local_10c = 0;
    local_110 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
    for (; this_01 = in_stack_ffffffffffffff28.m_floats._8_8_, local_10c < local_110;
        local_10c = local_10c + 1) {
      local_118 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_10c);
      operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffea8);
      local_128 = ::operator*((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                              in_stack_fffffffffffffea8->m_floats);
      btVector3::operator+=(&local_118->m_v,&local_128);
    }
  }
  dampClusters(this_01);
  applyClusters(this,i._3_1_);
  return;
}

Assistant:

void			btSoftBody::solveConstraints()
{

	/* Apply clusters		*/ 
	applyClusters(false);
	/* Prepare links		*/ 

	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&	l=m_links[i];
		l.m_c3		=	l.m_n[1]->m_q-l.m_n[0]->m_q;
		l.m_c2		=	1/(l.m_c3.length2()*l.m_c0);
	}
	/* Prepare anchors		*/ 
	for(i=0,ni=m_anchors.size();i<ni;++i)
	{
		Anchor&			a=m_anchors[i];
		const btVector3	ra=a.m_body->getWorldTransform().getBasis()*a.m_local;
		a.m_c0	=	ImpulseMatrix(	m_sst.sdt,
			a.m_node->m_im,
			a.m_body->getInvMass(),
			a.m_body->getInvInertiaTensorWorld(),
			ra);
		a.m_c1	=	ra;
		a.m_c2	=	m_sst.sdt*a.m_node->m_im;
		a.m_body->activate();
	}
	/* Solve velocities		*/ 
	if(m_cfg.viterations>0)
	{
		/* Solve			*/ 
		for(int isolve=0;isolve<m_cfg.viterations;++isolve)
		{
			for(int iseq=0;iseq<m_cfg.m_vsequence.size();++iseq)
			{
				getSolver(m_cfg.m_vsequence[iseq])(this,1);
			}
		}
		/* Update			*/ 
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_x	=	n.m_q+n.m_v*m_sst.sdt;
		}
	}
	/* Solve positions		*/ 
	if(m_cfg.piterations>0)
	{
		for(int isolve=0;isolve<m_cfg.piterations;++isolve)
		{
			const btScalar ti=isolve/(btScalar)m_cfg.piterations;
			for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
			{
				getSolver(m_cfg.m_psequence[iseq])(this,1,ti);
			}
		}
		const btScalar	vc=m_sst.isdt*(1-m_cfg.kDP);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	=	(n.m_x-n.m_q)*vc;
			n.m_f	=	btVector3(0,0,0);		
		}
	}
	/* Solve drift			*/ 
	if(m_cfg.diterations>0)
	{
		const btScalar	vcf=m_cfg.kVCF*m_sst.isdt;
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_q	=	n.m_x;
		}
		for(int idrift=0;idrift<m_cfg.diterations;++idrift)
		{
			for(int iseq=0;iseq<m_cfg.m_dsequence.size();++iseq)
			{
				getSolver(m_cfg.m_dsequence[iseq])(this,1,0);
			}
		}
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	+=	(n.m_x-n.m_q)*vcf;
		}
	}
	/* Apply clusters		*/ 
	dampClusters();
	applyClusters(true);
}